

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O2

string * __thiscall
Omega_h::Read<long>::name_abi_cxx11_(string *__return_storage_ptr__,Read<long> *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&((this->write_).shared_alloc_.alloc)->name)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return write_.name(); }